

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx2::forward
          (Yolov3DetectionOutput_x86_avx2 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  uint uVar3;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __last;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __first;
  ulong uVar4;
  bool bVar5;
  size_type sVar6;
  float *pfVar7;
  Yolov3DetectionOutput *pYVar8;
  reference pvVar9;
  reference this_00;
  reference pvVar10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  float fVar11;
  double dVar12;
  undefined1 auVar13 [16];
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float area;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float confidence;
  int mask;
  __m256 mi;
  float score;
  __m256 t;
  __m256 p_1;
  unsigned_long index;
  float *end8;
  int q;
  float *end;
  float *ptr;
  float class_score;
  int class_index;
  int j;
  int i;
  __m256i vi;
  int cs;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int biases_index;
  int p;
  int pp;
  int net_h;
  int net_w;
  size_t mask_offset;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blobs;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  size_t b;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffff7e0;
  Mat *in_stack_fffffffffffff7e8;
  undefined7 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f7;
  Yolov3DetectionOutput *in_stack_fffffffffffff7f8;
  size_type in_stack_fffffffffffff800;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  Mat *in_stack_fffffffffffff808;
  iterator in_stack_fffffffffffff810;
  float in_stack_fffffffffffff824;
  float in_stack_fffffffffffff828;
  float in_stack_fffffffffffff82c;
  float in_stack_fffffffffffff830;
  float in_stack_fffffffffffff834;
  uint in_stack_fffffffffffff838;
  float in_stack_fffffffffffff83c;
  const_iterator __position;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined1 local_7c0 [32];
  undefined8 uStack_7a8;
  int local_634;
  Yolov3DetectionOutput *local_618;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_610;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_5f8;
  BBoxRect *local_5e0;
  BBoxRect *local_5d8;
  BBoxRect *local_5d0;
  BBoxRect *local_5c8;
  reference local_5b8;
  int local_5ac;
  float local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  float local_594;
  int local_590;
  float local_58c;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  float local_578;
  float local_574;
  float local_570;
  float local_56c;
  float local_568;
  uint local_564;
  undefined1 local_560 [32];
  float local_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  long local_4d8;
  float *local_4d0;
  int local_4c4;
  float *local_4c0;
  float *local_4b8;
  float local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  int local_474;
  long local_470;
  int local_430;
  Mat local_428;
  float *local_3e0;
  Mat local_3d8;
  float *local_390;
  Mat local_388;
  float *local_340;
  Mat local_338;
  float *local_2f0;
  Mat local_2e8;
  float *local_2a0;
  float local_294;
  float local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  long local_278;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  const_reference local_258;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_240;
  ulong local_228;
  undefined1 local_220 [60];
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  uint local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  undefined4 local_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  undefined4 local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_220._32_8_ = in_RDX;
  local_220._40_8_ = in_RSI;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x6f73dc);
  local_228 = 0;
  while( true ) {
    uVar4 = local_228;
    sVar6 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_220._40_8_);
    if (sVar6 <= uVar4) break;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)0x6f742e);
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
    local_258 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_220._40_8_,
                           local_228);
    local_25c = local_258->w;
    local_260 = local_258->h;
    local_264 = local_258->c;
    local_268 = local_264 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if (local_268 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) + 5) {
      local_278 = local_228 * (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      pfVar7 = ncnn::Mat::operator[]
                         ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170),local_228);
      local_27c = (int)(*pfVar7 * (float)local_25c);
      pfVar7 = ncnn::Mat::operator[]
                         ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170),local_228);
      local_280 = (int)(*pfVar7 * (float)local_260);
      for (local_284 = 0; local_284 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_284 = local_284 + 1) {
        local_288 = local_284 * local_268;
        pfVar7 = ncnn::Mat::operator[]
                           ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128),
                            local_284 + local_278);
        local_28c = (int)*pfVar7;
        pfVar7 = ncnn::Mat::operator[]
                           ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0),
                            (long)(local_28c * 2));
        local_290 = *pfVar7;
        pfVar7 = ncnn::Mat::operator[]
                           ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0),
                            (long)(local_28c * 2 + 1));
        local_294 = *pfVar7;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffff810._M_current,
                           (int)((ulong)in_stack_fffffffffffff808 >> 0x20));
        pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_2e8);
        ncnn::Mat::~Mat((Mat *)0x6f7749);
        local_2a0 = pfVar7;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffff810._M_current,
                           (int)((ulong)in_stack_fffffffffffff808 >> 0x20));
        pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_338);
        ncnn::Mat::~Mat((Mat *)0x6f779d);
        local_2f0 = pfVar7;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffff810._M_current,
                           (int)((ulong)in_stack_fffffffffffff808 >> 0x20));
        pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_388);
        ncnn::Mat::~Mat((Mat *)0x6f77f2);
        local_340 = pfVar7;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffff810._M_current,
                           (int)((ulong)in_stack_fffffffffffff808 >> 0x20));
        pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_3d8);
        ncnn::Mat::~Mat((Mat *)0x6f7847);
        local_390 = pfVar7;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffff810._M_current,
                           (int)((ulong)in_stack_fffffffffffff808 >> 0x20));
        pfVar7 = ncnn::Mat::operator_cast_to_float_(&local_428);
        ncnn::Mat::~Mat((Mat *)0x6f789c);
        local_3e0 = pfVar7;
        ncnn::Mat::channel_range
                  ((Mat *)in_stack_fffffffffffff810._M_current,
                   (int)((ulong)in_stack_fffffffffffff808 >> 0x20),(int)in_stack_fffffffffffff808);
        local_474 = local_430;
        local_1cc = local_430 * 2;
        local_1d0 = local_430 * 3;
        local_1d4 = local_430 << 2;
        local_1d8 = local_430 * 5;
        local_1dc = local_430 * 6;
        local_1e0 = local_430 * 7;
        local_1c4 = 0;
        local_1c8 = local_430;
        local_4c = local_430;
        local_50 = 0;
        auVar2 = vpinsrd_avx(ZEXT416(local_1d4),local_1d8,1);
        auVar2 = vpinsrd_avx(auVar2,local_1dc,2);
        auVar2 = vpinsrd_avx(auVar2,local_1e0,3);
        auVar13 = vpinsrd_avx(ZEXT416(0),local_430,1);
        auVar13 = vpinsrd_avx(auVar13,local_1cc,2);
        auVar13 = vpinsrd_avx(auVar13,local_1d0,3);
        local_80._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar13;
        local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
        local_48 = local_1cc;
        local_44 = local_1d0;
        local_40 = local_1d4;
        local_3c = local_1d8;
        local_38 = local_1dc;
        local_34 = local_1e0;
        local_4a0 = local_80._0_16_;
        auStack_490 = local_80._16_16_;
        for (local_4a4 = 0; local_4a4 < local_260; local_4a4 = local_4a4 + 1) {
          for (local_4a8 = 0; local_4a8 < local_25c; local_4a8 = local_4a8 + 1) {
            local_4ac = 0;
            local_4b0 = -3.4028235e+38;
            local_4b8 = (float *)(local_470 + (long)(local_4a4 * local_25c) * 4 +
                                 (long)local_4a8 * 4);
            local_4c0 = local_4b8 +
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * local_474;
            local_4c4 = 0;
            local_4d0 = local_4b8 +
                        (int)((*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) &
                              0xfffffff8) * local_474);
            for (; local_4b8 < local_4d0; local_4b8 = local_4b8 + (local_474 << 3)) {
              local_1a0._8_8_ = SUB328(ZEXT832(0),4);
              local_1c0._8_8_ = SUB328(ZEXT832(0),4);
              auVar1 = vcmpps_avx(ZEXT832((ulong)local_1a0._8_8_) << 0x40,
                                  ZEXT832((ulong)local_1c0._8_8_) << 0x40,0);
              local_500 = vgatherdps(ZEXT832(0) << 0x20,auVar1);
              local_100 = vpermpd_avx2(local_500,0x4e);
              local_120 = vmaxps_avx(local_500,local_100);
              local_140 = vpermilpd_avx(local_120,5);
              local_160 = vmaxps_avx(local_120,local_140);
              local_180 = vpermilps_avx(local_160,0xb1);
              local_7c0 = vmaxps_avx(local_160,local_180);
              uStack_518 = uStack_7b8;
              uStack_510 = uStack_7b0;
              uStack_508 = uStack_7a8;
              uStack_a8 = uStack_7b8;
              local_b0._0_4_ = local_7c0._0_4_;
              local_524 = (float)local_b0;
              if (local_4b0 < (float)local_b0) {
                local_560 = vcmpps_avx(local_500,local_7c0,0);
                local_a0 = local_560._0_8_;
                uStack_98 = local_560._8_8_;
                uStack_90 = local_560._16_8_;
                uStack_88 = local_560._24_8_;
                in_stack_fffffffffffff838 = vmovmskps_avx(local_560);
                local_4ac = 0;
                for (uVar3 = in_stack_fffffffffffff838; (uVar3 & 1) == 0;
                    uVar3 = uVar3 >> 1 | 0x80000000) {
                  local_4ac = local_4ac + 1;
                }
                local_4d8 = (long)local_4ac;
                local_4ac = local_4c4 + local_4ac;
                local_4b0 = (float)local_b0;
                local_564 = in_stack_fffffffffffff838;
              }
              local_4c4 = local_4c4 + 8;
              in_stack_fffffffffffff83c = (float)local_b0;
              local_520 = __position._M_current;
              local_1c0 = ZEXT832(0) << 0x20;
              local_1a0 = ZEXT832(0) << 0x20;
              local_e0 = local_500;
              local_b0 = __position._M_current;
            }
            for (; local_4b8 < local_4c0; local_4b8 = local_4b8 + local_474) {
              if (local_4b0 < *local_4b8) {
                local_4ac = local_4c4;
                local_4b0 = *local_4b8;
              }
              local_4c4 = local_4c4 + 1;
            }
            dVar12 = std::exp((double)((ulong)(uint)*local_3e0 ^ 0x8000000080000000));
            in_stack_fffffffffffff834 = SUB84(dVar12,0);
            dVar12 = std::exp((double)((ulong)(uint)local_4b0 ^ 0x8000000080000000));
            in_stack_fffffffffffff830 = SUB84(dVar12,0);
            local_568 = 1.0 / (in_stack_fffffffffffff834 * (in_stack_fffffffffffff830 + 1.0) + 1.0);
            if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= local_568) {
              in_stack_fffffffffffff828 = (float)local_4a8;
              in_stack_fffffffffffff82c = sigmoid(0.0);
              local_56c = (in_stack_fffffffffffff828 + in_stack_fffffffffffff82c) / (float)local_25c
              ;
              fVar11 = (float)local_4a4;
              in_stack_fffffffffffff824 = sigmoid(0.0);
              local_570 = (fVar11 + in_stack_fffffffffffff824) / (float)local_260;
              dVar12 = std::exp((double)(ulong)(uint)*local_340);
              local_574 = (SUB84(dVar12,0) * local_290) / (float)local_27c;
              dVar12 = std::exp((double)(ulong)(uint)*local_390);
              local_578 = (SUB84(dVar12,0) * local_294) / (float)local_280;
              auVar13 = SUB6416(ZEXT464(0x3f000000),0);
              auVar2 = vfnmadd213ss_fma(auVar13,ZEXT416((uint)local_574),ZEXT416((uint)local_56c));
              local_5a4 = auVar2._0_4_;
              auVar2 = vfnmadd213ss_fma(auVar13,ZEXT416((uint)local_578),ZEXT416((uint)local_570));
              local_5a0 = auVar2._0_4_;
              auVar2 = vfmadd213ss_fma(auVar13,ZEXT416((uint)local_574),ZEXT416((uint)local_56c));
              local_59c = auVar2._0_4_;
              auVar2 = vfmadd213ss_fma(auVar13,ZEXT416((uint)local_578),ZEXT416((uint)local_570));
              local_598 = auVar2._0_4_;
              local_594 = local_574 * local_578;
              local_5a8 = local_568;
              local_590 = local_4ac;
              local_58c = local_594;
              local_588 = local_598;
              local_584 = local_59c;
              local_580 = local_5a0;
              local_57c = local_5a4;
              std::
              vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ::operator[](&local_240,(long)local_284);
              std::
              vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           *)in_stack_fffffffffffff7f8,
                          (value_type *)
                          CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
            }
            local_2a0 = local_2a0 + 1;
            local_2f0 = local_2f0 + 1;
            local_340 = local_340 + 1;
            local_390 = local_390 + 1;
            local_3e0 = local_3e0 + 1;
          }
        }
        ncnn::Mat::~Mat((Mat *)0x6f835c);
      }
      for (local_5ac = 0; local_5ac < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_5ac = local_5ac + 1) {
        local_5b8 = std::
                    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ::operator[](&local_240,(long)local_5ac);
        in_stack_fffffffffffff808 = (Mat *)local_220;
        local_5c8 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffff7e0);
        __gnu_cxx::
        __normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>
        ::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect*>
                  ((__normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffff7e8,
                   (__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffff7e0);
        local_5d0 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::begin(in_stack_fffffffffffff7e0);
        local_5d8 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffff7e0);
        __first._M_current._4_4_ = in_stack_fffffffffffff83c;
        __first._M_current._0_4_ = in_stack_fffffffffffff838;
        __last._M_current._4_4_ = in_stack_fffffffffffff834;
        __last._M_current._0_4_ = in_stack_fffffffffffff830;
        in_stack_fffffffffffff810 =
             std::
             vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
             ::
             insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                       ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),__position,
                        __first,__last);
        local_5e0 = in_stack_fffffffffffff810._M_current;
      }
      local_26c = 0;
    }
    else {
      local_1e4 = -1;
      local_26c = 1;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)in_stack_fffffffffffff7f8);
    if (local_26c != 0) goto LAB_006f883d;
    local_228 = local_228 + 1;
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            (in_stack_fffffffffffff7f8,
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  pvVar14 = &local_5f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x6f84eb);
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),in_stack_fffffffffffff824
            );
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x6f852a);
  local_618 = (Yolov3DetectionOutput *)0x0;
  while( true ) {
    in_stack_fffffffffffff7f8 = local_618;
    pYVar8 = (Yolov3DetectionOutput *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_5f8);
    if (pYVar8 <= in_stack_fffffffffffff7f8) break;
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_5f8,(size_type)local_618);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::operator[]((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                  *)local_220,*pvVar9);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 *)in_stack_fffffffffffff7f8,
                (value_type *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    local_618 = (Yolov3DetectionOutput *)((long)&(local_618->super_Layer)._vptr_Layer + 1);
  }
  sVar6 = std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ::size(&local_610);
  if ((int)sVar6 == 0) {
    local_1e4 = 0;
  }
  else {
    this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_220._32_8_,0);
    ncnn::Mat::create(in_stack_fffffffffffff808,(int)((ulong)pvVar14 >> 0x20),(int)pvVar14,
                      (size_t)in_stack_fffffffffffff7f8,
                      (Allocator *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    bVar5 = ncnn::Mat::empty(in_stack_fffffffffffff7e8);
    if (bVar5) {
      local_1e4 = -100;
    }
    else {
      for (local_634 = 0; local_634 < (int)sVar6; local_634 = local_634 + 1) {
        pvVar10 = std::
                  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                  ::operator[](&local_610,(long)local_634);
        fVar11 = pvVar10->score;
        pfVar7 = ncnn::Mat::row(this_00,local_634);
        *pfVar7 = (float)(pvVar10->label + 1);
        pfVar7[1] = fVar11;
        pfVar7[2] = pvVar10->xmin;
        pfVar7[3] = pvVar10->ymin;
        pfVar7[4] = pvVar10->xmax;
        pfVar7[5] = pvVar10->ymax;
      }
      local_1e4 = 0;
    }
  }
  local_26c = 1;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)in_stack_fffffffffffff7f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff7f8);
LAB_006f883d:
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)in_stack_fffffffffffff7f8);
  return local_1e4;
}

Assistant:

int Yolov3DetectionOutput_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}